

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

bool __thiscall Cmd::addHistoryEntry(Cmd *this,string *line)

{
  pointer pbVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  
  pbVar1 = (this->history_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->history_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start == pbVar1) ||
     (__n = pbVar1[-1]._M_string_length, __n != line->_M_string_length)) {
LAB_001031ef:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->history_,line);
    bVar2 = true;
  }
  else {
    if (__n != 0) {
      iVar3 = bcmp(pbVar1[-1]._M_dataplus._M_p,(line->_M_dataplus)._M_p,__n);
      if (iVar3 != 0) goto LAB_001031ef;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool addHistoryEntry(const std::string &line) {

		// Don't add duplicated lines.
		if (!history_.empty() && history_.back() == line) {
			return false;
		}

		history_.push_back(line);
		return true;
	}